

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

tjhandle tjInitCompress(void)

{
  void *this;
  tjhandle pvVar1;
  long in_FS_OFFSET;
  
  this = calloc(1,0x6d8);
  if (this != (void *)0x0) {
    *(undefined8 *)((long)this + 0x608) = 0x726f727265206f4e;
    *(undefined1 *)((long)this + 0x610) = 0;
    pvVar1 = _tjInitCompress(this);
    return pvVar1;
  }
  builtin_strncpy((char *)(in_FS_OFFSET + -0xb4),"ocation ",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xac),"failure",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xc0),": Memory",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xb8)," allocat",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjInitCo",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -200),"mpress()",8);
  return (tjhandle)0x0;
}

Assistant:

DLLEXPORT tjhandle tjInitCompress(void)
{
  tjinstance *this = NULL;

  if ((this = (tjinstance *)malloc(sizeof(tjinstance))) == NULL) {
    snprintf(errStr, JMSG_LENGTH_MAX,
             "tjInitCompress(): Memory allocation failure");
    return NULL;
  }
  MEMZERO(this, sizeof(tjinstance));
  snprintf(this->errStr, JMSG_LENGTH_MAX, "No error");
  return _tjInitCompress(this);
}